

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_node.c
# Opt level: O3

LY_ERR lys_compile_when(lysc_ctx *ctx,lysp_when *when_p,uint16_t inherited_flags,lysc_node *parent,
                       lysc_node *ctx_node,lysc_node *node,lysc_when **when_c)

{
  lysc_when **pplVar1;
  lysc_when *plVar2;
  lysp_ext_instance *plVar3;
  long lVar4;
  uint16_t parent_flags;
  LY_ERR LVar5;
  lysc_when ***ppplVar6;
  long *plVar7;
  lyxp_expr **expr_p;
  size_t value_len;
  undefined8 *object;
  lysp_ext_instance *plVar8;
  lysp_ext_instance *plVar9;
  ly_ctx *plVar10;
  undefined8 *__ptr;
  char *pcVar11;
  LY_ERR LVar12;
  void **ppvVar13;
  void *pvVar14;
  long lVar15;
  long lVar16;
  lysc_when *ptr;
  void *local_40;
  LY_VALUE_FORMAT local_34;
  
  if ((when_p == (lysp_when *)0x0) || (node == (lysc_node *)0x0 && when_c == (lysc_when **)0x0)) {
    __assert_fail("when_p && (node || when_c)",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile_node.c"
                  ,0x20a,
                  "LY_ERR lys_compile_when(struct lysc_ctx *, const struct lysp_when *, uint16_t, const struct lysc_node *, const struct lysc_node *, struct lysc_node *, struct lysc_when **)"
                 );
  }
  if (node != (lysc_node *)0x0) {
    ppplVar6 = lysc_node_when_p(node);
    pplVar1 = *ppplVar6;
    if (pplVar1 == (lysc_when **)0x0) {
      plVar7 = (long *)malloc(0x10);
      if (plVar7 != (long *)0x0) {
        *plVar7 = 1;
        goto LAB_00144116;
      }
    }
    else {
      plVar2 = pplVar1[-1];
      pplVar1[-1] = (lysc_when *)((long)&plVar2->cond + 1);
      plVar7 = (long *)realloc(pplVar1 + -1,(long)plVar2 * 8 + 0x10);
      if (plVar7 != (long *)0x0) {
LAB_00144116:
        *ppplVar6 = (lysc_when **)(plVar7 + 1);
        ppvVar13 = (void **)(plVar7 + *plVar7);
        *ppvVar13 = (void *)0x0;
        goto LAB_0014412d;
      }
      (*ppplVar6)[-1] = (lysc_when *)&(*ppplVar6)[-1][-1].field_0x37;
    }
LAB_00144237:
    plVar10 = ctx->ctx;
    pcVar11 = "lys_compile_when";
    goto LAB_0014425b;
  }
  local_40 = calloc(1,0x38);
  if (local_40 == (void *)0x0) goto LAB_00144237;
  ppvVar13 = &local_40;
LAB_0014412d:
  if ((when_c == (lysc_when **)0x0) || (plVar2 = *when_c, plVar2 == (lysc_when *)0x0)) {
    expr_p = (lyxp_expr **)calloc(1,0x38);
    *ppvVar13 = expr_p;
    if (expr_p == (lyxp_expr **)0x0) {
      plVar10 = ctx->ctx;
LAB_0014424d:
      pcVar11 = "lys_compile_when_";
LAB_0014425b:
      ly_log(plVar10,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",pcVar11);
      return LY_EMEM;
    }
    *(undefined4 *)(expr_p + 6) = 1;
    LVar5 = lyxp_expr_parse(ctx->ctx,when_p->cond,0,'\x01',expr_p);
    if (LVar5 != LY_SUCCESS) {
      return LVar5;
    }
    plVar10 = ctx->ctx;
    pcVar11 = when_p->cond;
    value_len = strlen(pcVar11);
    LVar5 = lyplg_type_prefix_data_new
                      (plVar10,pcVar11,value_len,LY_VALUE_SCHEMA,ctx->pmod,&local_34,
                       (void **)((long)*ppvVar13 + 0x10));
    if (LVar5 != LY_SUCCESS) {
      return LVar5;
    }
    *(lysc_node **)((long)*ppvVar13 + 8) = ctx_node;
    LVar5 = lydict_dup(ctx->ctx,when_p->dsc,(char **)((long)*ppvVar13 + 0x18));
    if (LVar5 != LY_SUCCESS) {
      return LVar5;
    }
    LVar5 = lydict_dup(ctx->ctx,when_p->ref,(char **)((long)*ppvVar13 + 0x20));
    if (LVar5 != LY_SUCCESS) {
      return LVar5;
    }
    plVar8 = when_p->exts;
    if (plVar8 != (lysp_ext_instance *)0x0) {
      pvVar14 = *ppvVar13;
      lVar16 = *(long *)((long)pvVar14 + 0x28);
      if (lVar16 == 0) {
        plVar7 = (long *)calloc(1,(long)plVar8[-1].exts * 0x48 + 8);
        if (plVar7 == (long *)0x0) goto LAB_0014439e;
        lVar15 = 0;
      }
      else {
        lVar15 = *(long *)(lVar16 + -8);
        plVar7 = (long *)realloc((void *)(lVar16 + -8),
                                 ((long)&(plVar8[-1].exts)->name + lVar15 * 2) * 0x48 + 8);
        if (plVar7 == (long *)0x0) {
LAB_0014439e:
          plVar10 = ctx->ctx;
          goto LAB_0014424d;
        }
        pvVar14 = *ppvVar13;
      }
      *(long **)((long)pvVar14 + 0x28) = plVar7 + 1;
      if (*(long *)((long)*ppvVar13 + 0x28) != 0) {
        if (when_p->exts == (lysp_ext_instance *)0x0) {
          plVar8 = (lysp_ext_instance *)0x0;
        }
        else {
          plVar8 = when_p->exts[-1].exts;
        }
        memset((void *)(*(long *)((long)*ppvVar13 + 0x28) + *plVar7 * 0x48),0,
               ((long)&plVar8->name + lVar15) * 0x48);
      }
      lVar16 = 0;
      plVar8 = (lysp_ext_instance *)0x0;
      while( true ) {
        plVar3 = when_p->exts;
        if (plVar3 == (lysp_ext_instance *)0x0) {
          plVar9 = (lysp_ext_instance *)0x0;
        }
        else {
          plVar9 = plVar3[-1].exts;
        }
        if (plVar9 <= plVar8) break;
        pvVar14 = *ppvVar13;
        lVar15 = *(long *)((long)pvVar14 + 0x28);
        lVar4 = *(long *)(lVar15 + -8);
        *(long *)(lVar15 + -8) = lVar4 + 1;
        LVar5 = lys_compile_ext(ctx,(lysp_ext_instance *)((long)&plVar3->name + lVar16),
                                (lysc_ext_instance *)(lVar15 + lVar4 * 0x48),pvVar14);
        if (LVar5 != LY_SUCCESS) {
          if (LVar5 != LY_ENOT) {
            return LVar5;
          }
          plVar7 = (long *)(*(long *)((long)*ppvVar13 + 0x28) + -8);
          *plVar7 = *plVar7 + -1;
        }
        plVar8 = (lysp_ext_instance *)((long)&plVar8->name + 1);
        lVar16 = lVar16 + 0x70;
      }
    }
    if (parent == (lysc_node *)0x0) {
      parent_flags = 0;
      pcVar11 = (char *)0x0;
    }
    else {
      parent_flags = parent->flags;
      pcVar11 = parent->name;
    }
    LVar5 = lys_compile_status(ctx,0,inherited_flags,parent_flags,pcVar11,"when",
                               (uint16_t *)((long)*ppvVar13 + 0x34));
    if (LVar5 != LY_SUCCESS) {
      return LVar5;
    }
    if (when_c != (lysc_when **)0x0) {
      *when_c = (lysc_when *)*ppvVar13;
    }
  }
  else {
    plVar2->refcount = plVar2->refcount + 1;
    *ppvVar13 = plVar2;
  }
  if (node == (lysc_node *)0x0) {
    return LY_SUCCESS;
  }
  if ((ctx->compile_opts & 3) == 0) {
    pvVar14 = *ppvVar13;
    object = (undefined8 *)calloc(1,0x10);
    if (object != (undefined8 *)0x0) {
      *object = node;
      object[1] = pvVar14;
      LVar12 = LY_SUCCESS;
      LVar5 = ly_set_add(&ctx->unres->whens,object,'\x01',(uint32_t *)0x0);
      __ptr = (undefined8 *)0x0;
      if (LVar5 == LY_SUCCESS) goto LAB_001442e7;
    }
    LVar12 = LY_EMEM;
    ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lysc_unres_when_add");
    __ptr = object;
  }
  else {
    LVar12 = LY_SUCCESS;
    __ptr = (undefined8 *)0x0;
  }
LAB_001442e7:
  free(__ptr);
  return LVar12;
}

Assistant:

LY_ERR
lys_compile_when(struct lysc_ctx *ctx, const struct lysp_when *when_p, uint16_t inherited_flags, const struct lysc_node *parent,
        const struct lysc_node *ctx_node, struct lysc_node *node, struct lysc_when **when_c)
{
    LY_ERR rc = LY_SUCCESS;
    struct lysc_when **new_when, ***node_when, *ptr;

    assert(when_p && (node || when_c));

    if (node) {
        /* get the when array */
        node_when = lysc_node_when_p(node);

        /* create new when pointer */
        LY_ARRAY_NEW_GOTO(ctx->ctx, *node_when, new_when, rc, cleanup);
    } else {
        /* individual when */
        new_when = &ptr;
        *new_when = calloc(1, sizeof **new_when);
        LY_CHECK_ERR_GOTO(!*new_when, LOGMEM(ctx->ctx); rc = LY_EMEM, cleanup);
    }

    if (!when_c || !(*when_c)) {
        /* compile when */
        LY_CHECK_GOTO(rc = lys_compile_when_(ctx, when_p, inherited_flags, parent, ctx_node, new_when), cleanup);

        /* remember the compiled when for sharing */
        if (when_c) {
            *when_c = *new_when;
        }
    } else {
        /* use the previously compiled when */
        ++(*when_c)->refcount;
        *new_when = *when_c;
    }

    if (node) {
        /* add when to unres if there is a node for evaluation (not for extension instances) */
        LY_CHECK_GOTO(rc = lysc_unres_when_add(ctx, *new_when, node), cleanup);
    }

cleanup:
    return rc;
}